

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetLibraryNames
          (cmGeneratorTarget *this,string *name,string *soName,string *realName,string *impName,
          string *pdbName,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  char *version;
  char *version_00;
  string prefix;
  string base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string *local_78;
  string suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78 = pdbName;
  if (this->Target->IsImportedTarget == true) {
    std::__cxx11::string::string
              ((string *)&prefix,"GetLibraryNames called on imported target: ",(allocator *)&base);
    std::__cxx11::string::append((string *)&prefix);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&prefix);
  }
  else {
    std::__cxx11::string::string((string *)&prefix,"VERSION",(allocator *)&base);
    pcVar3 = GetProperty(this,&prefix);
    std::__cxx11::string::~string((string *)&prefix);
    std::__cxx11::string::string((string *)&prefix,"SOVERSION",(allocator *)&base);
    version = GetProperty(this,&prefix);
    std::__cxx11::string::~string((string *)&prefix);
    bVar1 = HasSOName(this,config);
    if (bVar1) {
      this_00 = this->Makefile;
      std::__cxx11::string::string
                ((string *)&prefix,"CMAKE_PLATFORM_NO_VERSIONED_SONAME",(allocator *)&base);
      bVar1 = cmMakefile::IsOn(this_00,&prefix);
      bVar2 = true;
      if (!bVar1) {
        bVar2 = IsFrameworkOnApple(this);
      }
      std::__cxx11::string::~string((string *)&prefix);
      if (bVar2 != false) {
        version = (char *)0x0;
        pcVar3 = (char *)0x0;
      }
    }
    else {
      version = (char *)0x0;
      pcVar3 = (char *)0x0;
    }
    version_00 = pcVar3;
    if (version != (char *)0x0) {
      version_00 = version;
    }
    if (pcVar3 == (char *)0x0) {
      version_00 = version;
    }
    if (version_00 == (char *)0x0) {
      version = pcVar3;
    }
    if (pcVar3 != (char *)0x0) {
      version = pcVar3;
    }
    prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
    prefix._M_string_length = 0;
    base._M_dataplus._M_p = (pointer)&base.field_2;
    base._M_string_length = 0;
    prefix.field_2._M_local_buf[0] = '\0';
    base.field_2._M_local_buf[0] = '\0';
    suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
    suffix._M_string_length = 0;
    suffix.field_2._M_local_buf[0] = '\0';
    GetFullNameInternal(this,config,RuntimeBinaryArtifact,&prefix,&base,&suffix);
    std::operator+(&local_50,&prefix,&base);
    std::operator+(&local_98,&local_50,&suffix);
    std::__cxx11::string::operator=((string *)name,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_50);
    bVar1 = IsFrameworkOnApple(this);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)realName);
      bVar1 = cmMakefile::PlatformIsAppleIos(this->Makefile);
      if (!bVar1) {
        std::__cxx11::string::append((char *)realName);
        GetFrameworkVersion_abi_cxx11_(&local_98,this);
        std::__cxx11::string::append((string *)realName);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::append((char *)realName);
      }
      std::__cxx11::string::append((string *)realName);
      std::__cxx11::string::_M_assign((string *)soName);
    }
    else {
      ComputeVersionedName(this,soName,&prefix,&base,&suffix,name,version_00);
      ComputeVersionedName(this,realName,&prefix,&base,&suffix,name,version);
    }
    if ((this->Target->TargetTypeValue & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
      GetFullNameInternal(&local_98,this,config,ImportLibraryArtifact);
      std::__cxx11::string::operator=((string *)impName,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    else {
      std::__cxx11::string::assign((char *)impName);
    }
    GetPDBName(&local_98,this,config);
    std::__cxx11::string::operator=((string *)local_78,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&suffix);
    std::__cxx11::string::~string((string *)&base);
  }
  std::__cxx11::string::~string((string *)&prefix);
  return;
}

Assistant:

void cmGeneratorTarget::GetLibraryNames(std::string& name, std::string& soName,
                                        std::string& realName,
                                        std::string& impName,
                                        std::string& pdbName,
                                        const std::string& config) const
{
  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if (this->IsImported()) {
    std::string msg = "GetLibraryNames called on imported target: ";
    msg += this->GetName();
    this->LocalGenerator->IssueMessage(cmake::INTERNAL_ERROR, msg);
    return;
  }

  // Check for library version properties.
  const char* version = this->GetProperty("VERSION");
  const char* soversion = this->GetProperty("SOVERSION");
  if (!this->HasSOName(config) ||
      this->Makefile->IsOn("CMAKE_PLATFORM_NO_VERSIONED_SONAME") ||
      this->IsFrameworkOnApple()) {
    // Versioning is supported only for shared libraries and modules,
    // and then only when the platform supports an soname flag.
    version = CM_NULLPTR;
    soversion = CM_NULLPTR;
  }
  if (version && !soversion) {
    // The soversion must be set if the library version is set.  Use
    // the library version as the soversion.
    soversion = version;
  }
  if (!version && soversion) {
    // Use the soversion as the library version.
    version = soversion;
  }

  // Get the components of the library name.
  std::string prefix;
  std::string base;
  std::string suffix;
  this->GetFullNameInternal(config, cmStateEnums::RuntimeBinaryArtifact,
                            prefix, base, suffix);

  // The library name.
  name = prefix + base + suffix;

  if (this->IsFrameworkOnApple()) {
    realName = prefix;
    if (!this->Makefile->PlatformIsAppleIos()) {
      realName += "Versions/";
      realName += this->GetFrameworkVersion();
      realName += "/";
    }
    realName += base;
    soName = realName;
  } else {
    // The library's soname.
    this->ComputeVersionedName(soName, prefix, base, suffix, name, soversion);

    // The library's real name on disk.
    this->ComputeVersionedName(realName, prefix, base, suffix, name, version);
  }

  // The import library name.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
      this->GetType() == cmStateEnums::MODULE_LIBRARY) {
    impName =
      this->GetFullNameInternal(config, cmStateEnums::ImportLibraryArtifact);
  } else {
    impName = "";
  }

  // The program database file name.
  pdbName = this->GetPDBName(config);
}